

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

Variable __thiscall
LiteScript::Callback::operator()
          (Callback *this,State *state,
          vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *args)

{
  pointer pvVar1;
  Namer *this_00;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *in_RCX;
  uint *extraout_RDX;
  Variable VVar3;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  uint *puVar2;
  
  Instruction::Instruction((Instruction *)local_70,INSTR_PUSH_NSP);
  State::ExecuteSingle((State *)&stack0xffffffffffffffc0,(Instruction *)args);
  Variable::~Variable((Variable *)&stack0xffffffffffffffc0);
  Instruction::~Instruction((Instruction *)local_70);
  if (*(char *)&(((state->args_tmp).
                  super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>).
                _M_impl.super__Vector_impl_data._M_start == '\0') {
    State::SetThis((State *)args,&state->nsp_global);
  }
  pvVar1 = (state->instr).
           super__Vector_base<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar1 == (pointer)0x0) {
    this_00 = State::GetNamer((State *)args);
    Namer::operator=(this_00,(Namer *)&(state->args_tmp).
                                       super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Memory::Create((Memory *)local_70,
                   (Type *)args[9].
                           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    Namer::Push(this_00,(Variable *)local_70);
    Variable::~Variable((Variable *)local_70);
    State::AddCallback((State *)args,
                       *(uint *)&(state->instr).
                                 super__Vector_base<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                       *(uint *)((long)&(state->instr).
                                        super__Vector_base<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 4));
    State::DefineArgs((State *)args,in_RCX);
    VVar3 = Memory::Create((Memory *)this,
                           (Type *)args[9].
                                   super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    puVar2 = VVar3.nb_ref;
  }
  else {
    (*(code *)pvVar1)(this,args);
    Instruction::Instruction((Instruction *)local_70,INSTR_POP_NSP);
    State::ExecuteSingle((State *)local_50,(Instruction *)args);
    Variable::~Variable((Variable *)local_50);
    Instruction::~Instruction((Instruction *)local_70);
    Instruction::Instruction((Instruction *)local_70,INSTR_VALUE_POP);
    State::ExecuteSingle((State *)local_60,(Instruction *)args);
    Variable::~Variable((Variable *)local_60);
    Instruction::~Instruction((Instruction *)local_70);
    puVar2 = extraout_RDX;
  }
  VVar3.nb_ref = puVar2;
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::Callback::operator()(State& state, std::vector<Variable> &args) {
    state.ExecuteSingle(Instruction(InstrCode::INSTR_PUSH_NSP));
    if (!this->This.isNull)
        state.SetThis(*this->This);
    if (this->call_ptr == nullptr) {
        Namer& namer = state.GetNamer();
        namer = *this->nsp;
        namer.Push(state.memory.Create(Type::NAMESPACE));
        state.AddCallback(this->intrl_idx, this->line_num);
        state.DefineArgs(args);
        return state.memory.Create(Type::UNDEFINED);
    }
    else {
        Variable result = this->call_ptr(state, args);
        state.ExecuteSingle(Instruction(InstrCode::INSTR_POP_NSP));
        state.ExecuteSingle(Instruction(InstrCode::INSTR_VALUE_POP));
        return result;
    }
}